

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExitNode.cpp
# Opt level: O0

void __thiscall ExitNode::printOutcomingEdges(ExitNode *this,ostream *ostream)

{
  bool bVar1;
  ostream *poVar2;
  ostream *poVar3;
  Node *in_RSI;
  JoinNode **joinSuccessor;
  iterator __end1;
  iterator __begin1;
  set<JoinNode_*,_std::less<JoinNode_*>,_std::allocator<JoinNode_*>_> *__range1;
  set<JoinNode_*,_std::less<JoinNode_*>,_std::allocator<JoinNode_*>_> *in_stack_ffffffffffffff78;
  string local_70 [24];
  Node *in_stack_ffffffffffffffa8;
  string local_50 [32];
  reference local_30;
  _Self local_28;
  _Self local_20;
  ostream *in_stack_ffffffffffffffe8;
  Node *pNVar4;
  
  Node::printOutcomingEdges(in_RSI,in_stack_ffffffffffffffe8);
  local_20._M_node =
       (_Base_ptr)
       std::set<JoinNode_*,_std::less<JoinNode_*>,_std::allocator<JoinNode_*>_>::begin
                 (in_stack_ffffffffffffff78);
  local_28._M_node =
       (_Base_ptr)
       std::set<JoinNode_*,_std::less<JoinNode_*>,_std::allocator<JoinNode_*>_>::end
                 (in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    local_30 = std::_Rb_tree_const_iterator<JoinNode_*>::operator*
                         ((_Rb_tree_const_iterator<JoinNode_*> *)0x1915ab);
    pNVar4 = in_RSI;
    Node::dotName_abi_cxx11_(in_stack_ffffffffffffffa8);
    poVar2 = std::operator<<((ostream *)in_RSI,local_50);
    poVar2 = std::operator<<(poVar2," -> ");
    Node::dotName_abi_cxx11_(in_stack_ffffffffffffffa8);
    poVar3 = std::operator<<(poVar2,local_70);
    std::operator<<(poVar3," [style=dashed]\n");
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_50);
    std::_Rb_tree_const_iterator<JoinNode_*>::operator++
              ((_Rb_tree_const_iterator<JoinNode_*> *)poVar2);
    in_RSI = pNVar4;
  }
  return;
}

Assistant:

void ExitNode::printOutcomingEdges(std::ostream &ostream) const {
    Node::printOutcomingEdges(ostream);
    for (const auto &joinSuccessor : joinSuccessors_) {
        ostream << this->dotName() << " -> " << joinSuccessor->dotName()
                << " [style=dashed]\n";
    }
}